

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O2

void __thiscall
sptk::SpectrumToSpectrum::SpectrumToSpectrum
          (SpectrumToSpectrum *this,int fft_length,InputOutputFormats input_format,
          InputOutputFormats output_format,double epsilon,double relative_floor_in_decibels)

{
  vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
  *this_00;
  double dVar1;
  bool bVar2;
  OperationInterface *pOVar3;
  InputOutputFormats input_format_00;
  InputOutputFormats output_format_00;
  _func_int **pp_Var4;
  OperationInterface *local_20;
  
  this->_vptr_SpectrumToSpectrum = (_func_int **)&PTR__SpectrumToSpectrum_00115900;
  this->fft_length_ = fft_length;
  this->input_format_ = input_format;
  this->output_format_ = output_format;
  this->epsilon_ = epsilon;
  this->relative_floor_in_decibels_ = relative_floor_in_decibels;
  (this->operations_).
  super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->operations_).
  super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operations_).
  super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->is_valid_ = true;
  if (0 < fft_length) {
    this_00 = &this->operations_;
    bVar2 = IsPowerOfTwo(fft_length);
    if ((((bVar2) &&
         (input_format_00 = this->input_format_, input_format_00 < kNumInputOutputFormats)) &&
        (output_format_00 = this->output_format_, output_format_00 < kNumInputOutputFormats)) &&
       ((dVar1 = this->epsilon_, 0.0 <= dVar1 && (this->relative_floor_in_decibels_ < 0.0)))) {
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        anon_unknown.dwarf_125fe::SelectOperation(input_format_00,kPowerSpectrum,this_00);
        local_20 = (OperationInterface *)operator_new(0x10);
        pp_Var4 = (_func_int **)this->epsilon_;
        local_20->_vptr_OperationInterface = (_func_int **)&PTR__OperationInterface_00115c30;
        local_20[1]._vptr_OperationInterface = pp_Var4;
        std::
        vector<sptk::SpectrumToSpectrum::OperationInterface*,std::allocator<sptk::SpectrumToSpectrum::OperationInterface*>>
        ::emplace_back<sptk::SpectrumToSpectrum::OperationInterface*>
                  ((vector<sptk::SpectrumToSpectrum::OperationInterface*,std::allocator<sptk::SpectrumToSpectrum::OperationInterface*>>
                    *)this_00,&local_20);
        output_format_00 = this->output_format_;
        input_format_00 = kPowerSpectrum;
      }
      anon_unknown.dwarf_125fe::SelectOperation(input_format_00,output_format_00,this_00);
      pp_Var4 = (_func_int **)this->relative_floor_in_decibels_;
      if (((double)pp_Var4 == -1.79769313486232e+308) && (!NAN((double)pp_Var4))) {
        return;
      }
      switch(this->output_format_) {
      case kLogAmplitudeSpectrumInDecibels:
        local_20 = (OperationInterface *)operator_new(0x10);
        local_20->_vptr_OperationInterface = (_func_int **)&PTR__OperationInterface_00115c70;
        local_20[1]._vptr_OperationInterface = pp_Var4;
        std::
        vector<sptk::SpectrumToSpectrum::OperationInterface*,std::allocator<sptk::SpectrumToSpectrum::OperationInterface*>>
        ::emplace_back<sptk::SpectrumToSpectrum::OperationInterface*>
                  ((vector<sptk::SpectrumToSpectrum::OperationInterface*,std::allocator<sptk::SpectrumToSpectrum::OperationInterface*>>
                    *)this_00,&local_20);
        return;
      case kLogAmplitudeSpectrum:
        local_20 = (OperationInterface *)operator_new(0x10);
        local_20->_vptr_OperationInterface = (_func_int **)&PTR__OperationInterface_00115c70;
        local_20[1]._vptr_OperationInterface = (_func_int **)((double)pp_Var4 / 8.685889638065035);
        std::
        vector<sptk::SpectrumToSpectrum::OperationInterface*,std::allocator<sptk::SpectrumToSpectrum::OperationInterface*>>
        ::emplace_back<sptk::SpectrumToSpectrum::OperationInterface*>
                  ((vector<sptk::SpectrumToSpectrum::OperationInterface*,std::allocator<sptk::SpectrumToSpectrum::OperationInterface*>>
                    *)this_00,&local_20);
        return;
      case kAmplitudeSpectrum:
        pOVar3 = (OperationInterface *)operator_new(0x10);
        pp_Var4 = (_func_int **)pow(10.0,(double)pp_Var4 * 0.05);
        pOVar3->_vptr_OperationInterface = (_func_int **)&PTR__OperationInterface_00115cb0;
        pOVar3[1]._vptr_OperationInterface = pp_Var4;
        local_20 = pOVar3;
        std::
        vector<sptk::SpectrumToSpectrum::OperationInterface*,std::allocator<sptk::SpectrumToSpectrum::OperationInterface*>>
        ::emplace_back<sptk::SpectrumToSpectrum::OperationInterface*>
                  ((vector<sptk::SpectrumToSpectrum::OperationInterface*,std::allocator<sptk::SpectrumToSpectrum::OperationInterface*>>
                    *)this_00,&local_20);
        return;
      case kPowerSpectrum:
        pOVar3 = (OperationInterface *)operator_new(0x10);
        pp_Var4 = (_func_int **)pow(10.0,(double)pp_Var4 * 0.1);
        pOVar3->_vptr_OperationInterface = (_func_int **)&PTR__OperationInterface_00115cb0;
        pOVar3[1]._vptr_OperationInterface = pp_Var4;
        local_20 = pOVar3;
        std::
        vector<sptk::SpectrumToSpectrum::OperationInterface*,std::allocator<sptk::SpectrumToSpectrum::OperationInterface*>>
        ::emplace_back<sptk::SpectrumToSpectrum::OperationInterface*>
                  ((vector<sptk::SpectrumToSpectrum::OperationInterface*,std::allocator<sptk::SpectrumToSpectrum::OperationInterface*>>
                    *)this_00,&local_20);
        return;
      default:
        return;
      }
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

SpectrumToSpectrum::SpectrumToSpectrum(int fft_length,
                                       InputOutputFormats input_format,
                                       InputOutputFormats output_format,
                                       double epsilon,
                                       double relative_floor_in_decibels)
    : fft_length_(fft_length),
      input_format_(input_format),
      output_format_(output_format),
      epsilon_(epsilon),
      relative_floor_in_decibels_(relative_floor_in_decibels),
      is_valid_(true) {
  if (fft_length_ <= 0 || !sptk::IsPowerOfTwo(fft_length_) ||
      input_format_ < 0 || kNumInputOutputFormats <= input_format_ ||
      output_format_ < 0 || kNumInputOutputFormats <= output_format_ ||
      epsilon_ < 0.0 || 0.0 <= relative_floor_in_decibels_) {
    is_valid_ = false;
    return;
  }

  if (0.0 != epsilon_) {
    SelectOperation(input_format_, kPowerSpectrum, &operations_);
    operations_.push_back(new Addition(epsilon_));
    SelectOperation(kPowerSpectrum, output_format_, &operations_);
  } else {
    SelectOperation(input_format_, output_format_, &operations_);
  }

  if (sptk::kMin != relative_floor_in_decibels_) {
    switch (output_format_) {
      case kLogAmplitudeSpectrumInDecibels: {
        operations_.push_back(
            new FlooringOnLogarithm(relative_floor_in_decibels_));
        break;
      }
      case kLogAmplitudeSpectrum: {
        operations_.push_back(new FlooringOnLogarithm(
            relative_floor_in_decibels_ / sptk::kNeper));
        break;
      }
      case kAmplitudeSpectrum: {
        operations_.push_back(new FlooringOnLinear(
            std::pow(10.0, 0.05 * relative_floor_in_decibels_)));
        break;
      }
      case kPowerSpectrum: {
        operations_.push_back(new FlooringOnLinear(
            std::pow(10.0, 0.1 * relative_floor_in_decibels_)));
        break;
      }
      default: {
        return;
      }
    }
  }
}